

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo.h
# Opt level: O3

void __thiscall TxInUndoFormatter::Ser<AutoFile>(TxInUndoFormatter *this,AutoFile *s,Coin *txout)

{
  size_t in_RCX;
  long in_FS_OFFSET;
  Wrapper<ScriptCompression,_const_CScript_&> local_28;
  Wrapper<AmountCompression,_const_long_&> local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  WriteVarInt<AutoFile,(VarIntMode)0,unsigned_int>(s,*(uint *)&txout->field_0x28);
  if (1 < *(uint *)&txout->field_0x28) {
    local_20.m_object = local_20.m_object & 0xffffffffffffff00;
    AutoFile::write(s,(int)&local_20,(void *)0x1,in_RCX);
  }
  local_28.m_object = &(txout->out).scriptPubKey;
  local_20.m_object = (long *)txout;
  SerializeMany<AutoFile,Wrapper<AmountCompression,long_const&>,Wrapper<ScriptCompression,CScript_const&>>
            (s,&local_20,&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream &s, const Coin& txout) {
        ::Serialize(s, VARINT(txout.nHeight * uint32_t{2} + txout.fCoinBase ));
        if (txout.nHeight > 0) {
            // Required to maintain compatibility with older undo format.
            ::Serialize(s, (unsigned char)0);
        }
        ::Serialize(s, Using<TxOutCompression>(txout.out));
    }